

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free.c
# Opt level: O3

void mi_free_block_delayed_mt(mi_page_t *page,mi_block_t *block)

{
  uintptr_t uVar1;
  mi_encoded_t mVar2;
  mi_encoded_t mVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar4 = page->xthread_free;
  do {
    while ((uVar4 & 3) != 0) {
      block->next = uVar4 & 0xfffffffffffffffc;
      LOCK();
      uVar5 = page->xthread_free;
      bVar6 = uVar4 == uVar5;
      if (bVar6) {
        page->xthread_free = uVar4 & 3 | (ulong)block;
        uVar5 = uVar4;
      }
      UNLOCK();
      uVar4 = uVar5;
      if (bVar6) {
        return;
      }
    }
    LOCK();
    uVar5 = page->xthread_free;
    bVar6 = uVar4 == uVar5;
    if (bVar6) {
      page->xthread_free = uVar4 | 1;
      uVar5 = uVar4;
    }
    UNLOCK();
    uVar4 = uVar5;
  } while (!bVar6);
  uVar1 = page->xheap;
  if (uVar1 != 0) {
    mVar2 = *(mi_encoded_t *)(uVar1 + 8);
    do {
      block->next = mVar2;
      LOCK();
      mVar3 = *(mi_encoded_t *)(uVar1 + 8);
      bVar6 = mVar2 == mVar3;
      if (bVar6) {
        *(mi_encoded_t *)(uVar1 + 8) = (mi_encoded_t)block;
        mVar3 = mVar2;
      }
      UNLOCK();
      mVar2 = mVar3;
    } while (!bVar6);
  }
  uVar4 = page->xthread_free;
  do {
    LOCK();
    uVar5 = page->xthread_free;
    bVar6 = uVar4 == uVar5;
    if (bVar6) {
      page->xthread_free = uVar4 & 0xfffffffffffffffc | 2;
      uVar5 = uVar4;
    }
    UNLOCK();
    uVar4 = uVar5;
  } while (!bVar6);
  return;
}

Assistant:

static void mi_decl_noinline mi_free_block_delayed_mt( mi_page_t* page, mi_block_t* block )
{
  // Try to put the block on either the page-local thread free list,
  // or the heap delayed free list (if this is the first non-local free in that page)
  mi_thread_free_t tfreex;
  bool use_delayed;
  mi_thread_free_t tfree = mi_atomic_load_relaxed(&page->xthread_free);
  do {
    use_delayed = (mi_tf_delayed(tfree) == MI_USE_DELAYED_FREE);
    if mi_unlikely(use_delayed) {
      // unlikely: this only happens on the first concurrent free in a page that is in the full list
      tfreex = mi_tf_set_delayed(tfree,MI_DELAYED_FREEING);
    }
    else {
      // usual: directly add to page thread_free list
      mi_block_set_next(page, block, mi_tf_block(tfree));
      tfreex = mi_tf_set_block(tfree,block);
    }
  } while (!mi_atomic_cas_weak_release(&page->xthread_free, &tfree, tfreex));

  // If this was the first non-local free, we need to push it on the heap delayed free list instead
  if mi_unlikely(use_delayed) {
    // racy read on `heap`, but ok because MI_DELAYED_FREEING is set (see `mi_heap_delete` and `mi_heap_collect_abandon`)
    mi_heap_t* const heap = (mi_heap_t*)(mi_atomic_load_acquire(&page->xheap)); //mi_page_heap(page);
    mi_assert_internal(heap != NULL);
    if (heap != NULL) {
      // add to the delayed free list of this heap. (do this atomically as the lock only protects heap memory validity)
      mi_block_t* dfree = mi_atomic_load_ptr_relaxed(mi_block_t, &heap->thread_delayed_free);
      do {
        mi_block_set_nextx(heap,block,dfree, heap->keys);
      } while (!mi_atomic_cas_ptr_weak_release(mi_block_t,&heap->thread_delayed_free, &dfree, block));
    }

    // and reset the MI_DELAYED_FREEING flag
    tfree = mi_atomic_load_relaxed(&page->xthread_free);
    do {
      tfreex = tfree;
      mi_assert_internal(mi_tf_delayed(tfree) == MI_DELAYED_FREEING);
      tfreex = mi_tf_set_delayed(tfree,MI_NO_DELAYED_FREE);
    } while (!mi_atomic_cas_weak_release(&page->xthread_free, &tfree, tfreex));
  }
}